

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stable-imu-fixed-contact-dynamical-system.cpp
# Opt level: O2

Vector __thiscall
stateObservation::flexibilityEstimation::StableIMUFixedContactDynamicalSystem::measureDynamics
          (StableIMUFixedContactDynamicalSystem *this,Vector *x,Vector *u,TimeIndex k)

{
  Index *this_00;
  double *pdVar1;
  Index IVar2;
  Matrix<double,_3,_3,_0,_3,_3> *x_00;
  Index extraout_RDX;
  ulong uVar3;
  TimeIndex in_R8;
  uint uVar4;
  Vector VVar5;
  int local_54c;
  undefined1 local_548 [16];
  scalar_constant_op<double> local_538;
  variable_if_dynamic<long,__1> local_530;
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *local_520;
  Matrix3 *local_4b8;
  Vector3 *local_4b0;
  Vector v;
  Vector3 acceleration;
  Vector3 accelerationControl;
  Vector3 velocityControl;
  Vector3 positionControl;
  Vector3 angularAccelerationFlex;
  Vector3 angularVelocityFlex;
  Vector3 accelerationFlex;
  Vector3 positionFlex;
  Quaternion q;
  Quaternion qFlex;
  Vector3 angularVelocityControl;
  Vector3 orientationControlV;
  Matrix3 rFlex;
  Vector3 orientationFlexV;
  Vector3 velocityFlex;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_2b0;
  Quaternion qControl;
  Vector3 angularVelocity;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
  local_190;
  Vector *local_168;
  Matrix<double,_3,_3,_0,_3,_3> *local_160;
  Matrix3 *local_150;
  Vector3 *local_148;
  MatrixBase<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
  local_140 [16];
  double local_130;
  RhsNested local_128;
  Matrix3 *local_118;
  Vector3 *local_110;
  undefined8 local_108 [2];
  undefined4 local_f8;
  uint uStack_f4;
  undefined4 uStack_f0;
  uint uStack_ec;
  undefined8 local_e8;
  double local_e0;
  undefined4 local_d8;
  uint uStack_d4;
  undefined4 uStack_d0;
  uint uStack_cc;
  undefined8 local_c8;
  undefined8 local_c0 [2];
  undefined4 local_b0;
  uint uStack_ac;
  undefined4 uStack_a8;
  uint uStack_a4;
  undefined8 local_a0;
  double local_98;
  undefined4 local_90;
  uint uStack_8c;
  undefined4 uStack_88;
  uint uStack_84;
  undefined8 local_80;
  Matrix<double,_3,_3,_0,_3,_3> local_78;
  
  DynamicalSystemFunctorBase::assertStateVector_((DynamicalSystemFunctorBase *)x,u);
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_548,u,0,3);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&positionFlex,
             (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *
             )local_548);
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_548,u,6,3);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&velocityFlex,
             (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *
             )local_548);
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_548,u,0xc,3);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&accelerationFlex,
             (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *
             )local_548);
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_548,u,3,3);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&orientationFlexV,
             (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *
             )local_548);
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_548,u,9,3);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&angularVelocityFlex,
             (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *
             )local_548);
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_548,u,0xf,3);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&angularAccelerationFlex,
             (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *
             )local_548);
  computeQuaternion_(&qFlex,(StableIMUFixedContactDynamicalSystem *)x,&orientationFlexV);
  Eigen::QuaternionBase<Eigen::Quaternion<double,_0>_>::toRotationMatrix
            ((QuaternionBase<Eigen::Quaternion<double,_0>_> *)&qFlex);
  DynamicalSystemFunctorBase::assertInputVector_((DynamicalSystemFunctorBase *)x,(Vector *)k);
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_548,
             (Matrix<double,__1,_1,_0,__1,_1> *)k,0,3);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&positionControl,
             (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *
             )local_548);
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_548,
             (Matrix<double,__1,_1,_0,__1,_1> *)k,6,3);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&velocityControl,
             (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *
             )local_548);
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_548,
             (Matrix<double,__1,_1,_0,__1,_1> *)k,0xc,3);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&accelerationControl,
             (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *
             )local_548);
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_548,
             (Matrix<double,__1,_1,_0,__1,_1> *)k,3,3);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&orientationControlV,
             (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *
             )local_548);
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_548,
             (Matrix<double,__1,_1,_0,__1,_1> *)k,9,3);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&angularVelocityControl,
             (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *
             )local_548);
  computeQuaternion_(&qControl,(StableIMUFixedContactDynamicalSystem *)x,&orientationControlV);
  Eigen::internal::
  quat_product<1,_Eigen::Quaternion<double,_0>,_Eigen::Quaternion<double,_0>,_double>::run
            ((QuaternionBase<Eigen::Quaternion<double,_0>_> *)&qFlex,
             (QuaternionBase<Eigen::Quaternion<double,_0>_> *)&qControl);
  v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = (double *)0x0;
  local_c0[0] = 0;
  uStack_ac = angularVelocityFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
              m_storage.m_data.array[1]._4_4_ ^ 0x80000000;
  uStack_a4 = angularVelocityFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
              m_storage.m_data.array[2]._4_4_ ^ 0x80000000;
  local_b0 = angularVelocityFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
             m_storage.m_data.array[1]._0_4_;
  uStack_a8 = angularVelocityFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
              m_storage.m_data.array[2]._0_4_;
  local_a0 = 0;
  uStack_88 = SUB84(angularVelocityFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                    .m_storage.m_data.array[0],0);
  local_98 = angularVelocityFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
             m_storage.m_data.array[0];
  uStack_84 = (uint)((ulong)angularVelocityFlex.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                            m_data.array[0] >> 0x20) ^ 0x80000000;
  local_90 = angularVelocityFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
             m_storage.m_data.array[1]._0_4_;
  uStack_8c = angularVelocityFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
              m_storage.m_data.array[1]._4_4_;
  local_80 = 0;
  tools::square<Eigen::Matrix<double,3,3,0,3,3>>(&local_78,(tools *)local_c0,x_00);
  local_148 = &positionControl;
  uStack_d0 = SUB84(angularVelocityFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                    .m_storage.m_data.array[0],0);
  local_108[0] = 0;
  uStack_cc = (uint)((ulong)angularVelocityFlex.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                            m_data.array[0] >> 0x20) ^ 0x80000000;
  uStack_f4 = angularVelocityFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
              m_storage.m_data.array[1]._4_4_ ^ 0x80000000;
  uStack_ec = angularVelocityFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
              m_storage.m_data.array[2]._4_4_ ^ 0x80000000;
  local_f8 = angularVelocityFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
             m_storage.m_data.array[1]._0_4_;
  uStack_f0 = angularVelocityFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
              m_storage.m_data.array[2]._0_4_;
  local_e8 = 0;
  local_54c = 2;
  local_e0 = angularVelocityFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
             m_storage.m_data.array[0];
  local_d8 = angularVelocityFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
             m_storage.m_data.array[1]._0_4_;
  uStack_d4 = angularVelocityFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
              m_storage.m_data.array[1]._4_4_;
  local_c8 = 0;
  local_168 = &v;
  local_160 = &local_78;
  local_150 = &rFlex;
  Eigen::operator*(&local_190,&local_54c,(StorageBaseType *)local_108);
  local_130 = local_190.m_lhs.m_functor.m_other;
  local_128 = local_190.m_rhs;
  local_110 = &velocityControl;
  local_118 = &rFlex;
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Matrix<double,3,1,0,3,1>,0>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
               *)&angularVelocity,
              (MatrixBase<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Matrix<double,3,1,0,3,1>,0>>
               *)&local_168,local_140);
  local_2b0.m_lhs.m_lhs.m_lhs.m_lhs.m_lhs =
       (LhsNested)
       angularVelocity.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
       .array[1];
  local_2b0.m_lhs.m_lhs.m_lhs.m_lhs.m_rhs =
       (RhsNested)
       angularVelocity.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
       .array[2];
  local_2b0.m_rhs = &accelerationFlex;
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                   *)(local_548 + 8),&local_2b0);
  local_4b0 = &accelerationControl;
  local_4b8 = &rFlex;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Matrix<double,3,1,0,3,1>,0>const,Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Matrix<double,3,1,0,3,1>,0>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>const>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&acceleration,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>_>
              *)local_548);
  local_548._0_8_ = &angularVelocityFlex;
  local_548._8_8_ = &rFlex;
  local_538.m_other = (double)&angularVelocityControl;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>const>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&angularVelocity,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>_>
              *)local_548);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero
            ((ConstantReturnType *)local_548,10,1);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((Matrix<double,_1,1,0,_1,1> *)&v,(ConstantReturnType *)local_548);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::head<4>
            ((Type *)local_548,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&v,4);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,4,1,false>,Eigen::Matrix<double,4,1,0,4,1>>
            ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false> *)local_548,&q.m_coeffs);
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_548,&v,4,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Matrix<double,3,1,0,3,1>>
            ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)local_548,&acceleration)
  ;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::tail<int>
            ((Type *)local_548,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&v,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Matrix<double,3,1,0,3,1>>
            ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)local_548,
             &angularVelocity);
  this_00 = &(x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  AlgebraicSensor::setState((AlgebraicSensor *)this_00,&v,in_R8);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero
            ((ConstantReturnType *)local_548,
             x[0x16].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
             ,1);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((Matrix<double,_1,1,0,_1,1> *)this,
             (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
              *)local_548);
  AlgebraicSensor::getMeasurements((AlgebraicSensor *)&local_2b0,SUB81(this_00,0));
  IVar2 = AlgebraicSensor::getMeasurementSize((AlgebraicSensor *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::head<long>
            ((Type *)local_548,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this,IVar2);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)local_548,
             (Matrix<double,__1,_1,_0,__1,_1> *)&local_2b0);
  free((void *)local_2b0._0_8_);
  uVar3 = 0;
  uVar4 = 0;
  while( true ) {
    pdVar1 = x[0x17].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
    ;
    if ((ulong)((x[0x17].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_rows - (long)pdVar1) / 0x18) <= (ulong)uVar4) break;
    local_538.m_other = (double)(pdVar1 + (ulong)uVar4 * 3);
    local_548._8_8_ = &rFlex;
    local_530.m_value = (long)&positionFlex;
    local_520 = (PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_538.m_other;
    IVar2 = AlgebraicSensor::getMeasurementSize((AlgebraicSensor *)this_00);
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&local_2b0,
               (Matrix<double,__1,_1,_0,__1,_1> *)this,IVar2 + uVar3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>>
              ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)&local_2b0,
               (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                *)local_548);
    uVar4 = uVar4 + 1;
    uVar3 = (ulong)((int)uVar3 + 3);
  }
  free(v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  VVar5.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  VVar5.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (Vector)VVar5.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Vector StableIMUFixedContactDynamicalSystem::measureDynamics(const Vector & x, const Vector & u, TimeIndex k)
{
  assertStateVector_(x);

  Vector3 positionFlex(x.segment(indexes::pos, 3));
  Vector3 velocityFlex(x.segment(indexes::linVel, 3));
  Vector3 accelerationFlex(x.segment(indexes::linAcc, 3));

  Vector3 orientationFlexV(x.segment(indexes::ori, 3));
  Vector3 angularVelocityFlex(x.segment(indexes::angVel, 3));
  Vector3 angularAccelerationFlex(x.segment(indexes::angAcc, 3));

  Quaternion qFlex(computeQuaternion_(orientationFlexV));
  Matrix3 rFlex(qFlex.toRotationMatrix());

  assertInputVector_(u);

  Vector3 positionControl(u.segment(indexes::pos, 3));
  Vector3 velocityControl(u.segment(indexes::linVel, 3));
  Vector3 accelerationControl(u.segment(indexes::linAcc, 3));

  Vector3 orientationControlV(u.segment(indexes::ori, 3));
  Vector3 angularVelocityControl(u.segment(indexes::angVel, 3));

  Quaternion qControl(computeQuaternion_(orientationControlV));

  Quaternion q = qFlex * qControl;

  Vector3 acceleration(
      (kine::skewSymmetric(angularAccelerationFlex) + tools::square(kine::skewSymmetric(angularVelocityFlex))) * rFlex
          * positionControl
      + 2 * kine::skewSymmetric(angularVelocityFlex) * rFlex * velocityControl + accelerationFlex
      + rFlex * accelerationControl);

  Vector3 angularVelocity(angularVelocityFlex + rFlex * angularVelocityControl);

  Vector v(Vector::Zero(10, 1));

  v.head<4>() = q.coeffs();

  v.segment(4, 3) = acceleration;
  v.tail(3) = angularVelocity;

  sensor_.setState(v, k);

  Vector y(Matrix::Zero(measurementSize_, 1));

  y.head(sensor_.getMeasurementSize()) = sensor_.getMeasurements();

  for(unsigned i = 0; i < contactPositions_.size(); ++i)
  {
    y.segment(sensor_.getMeasurementSize() + i * 3, 3) =
        rFlex * contactPositions_[i] + positionFlex - contactPositions_[i];
  }

  return y;
}